

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
ElementsTransactionApi_EstimateFee_LargeAmount_MinBits36_Test::TestBody
          (ElementsTransactionApi_EstimateFee_LargeAmount_MinBits36_Test *this)

{
  void *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  Amount *utxo_fee_00;
  Script *this_00;
  Amount AVar8;
  initializer_list<cfd::UtxoData> __l;
  initializer_list<cfd::api::ElementsUtxoAndOption> __l_00;
  AssertionResult gtest_ar_;
  uint32_t minimum_fee;
  ElementsTransactionApi api;
  ByteData tx;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  Amount tx_fee;
  Amount utxo_fee;
  Amount fee;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  utxos_and_options;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ElementsAddressFactory factory;
  ConfidentialTransactionContext txc;
  AssertionResult gtest_ar;
  ElementsUtxoAndOption eutxo1;
  ElementsConfidentialAddress asset_address;
  UtxoData utxo2;
  UtxoData utxo1;
  ElementsConfidentialAddress address;
  UtxoData utxo3;
  ElementsUtxoAndOption eutxo2;
  ElementsUtxoAndOption eutxo3;
  string local_3618;
  Privkey local_35f8;
  undefined1 local_35d8 [39];
  ElementsTransactionApi local_35b1;
  Pubkey local_35b0;
  ByteData local_3598;
  Amount local_3580;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_3570;
  Amount local_3558;
  Amount local_3548;
  Amount local_3538;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  local_3528;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  local_3510;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_34f8;
  SigHashType local_34dc;
  SigHashType local_34d0;
  SigHashType local_34c4;
  AddressFactory local_34b8;
  ConfidentialTransactionContext local_3490;
  undefined1 local_33b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_33b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_33a8 [81];
  undefined1 local_2e90 [64];
  uint32_t local_2e50;
  undefined1 local_2e48 [1320];
  undefined8 local_2920;
  Script local_2918;
  undefined4 local_28e0;
  UtxoData local_28d8;
  undefined8 local_23b0;
  Script local_23a8;
  undefined4 local_2370;
  undefined1 local_2368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2358 [81];
  undefined2 local_1e40;
  undefined1 uStack_1e3e;
  undefined1 uStack_1e3d;
  undefined4 uStack_1e3c;
  Script local_1e38;
  uint32_t local_1e00;
  ElementsConfidentialAddress local_1df8;
  UtxoData local_1c40;
  UtxoData local_1718;
  ElementsConfidentialAddress local_11f0;
  UtxoData local_1038;
  UtxoData local_b10;
  undefined2 local_5e8;
  undefined1 uStack_5e6;
  undefined1 uStack_5e5;
  undefined4 uStack_5e4;
  Script local_5e0;
  undefined4 local_5a8;
  UtxoData local_5a0;
  undefined2 local_78;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined4 uStack_74;
  Script local_70;
  undefined4 local_38;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_34b8,kElementsRegtest);
  cfd::UtxoData::UtxoData(&local_1718);
  local_1718.block_height = 0;
  local_1718.binary_data = (void *)0x0;
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_33b8,(string *)local_2368);
  cfd::core::Txid::operator=(&local_1718.txid,(Txid *)local_33b8);
  local_33b8 = (undefined1  [8])&PTR__Txid_0087c9b8;
  pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  local_1718.vout = 0;
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_33b8,(string *)local_2368);
  cfd::core::Script::operator=(&local_1718.locking_script,(Script *)local_33b8);
  cfd::core::Script::~Script((Script *)local_33b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph","");
  cfd::AddressFactory::GetAddress((Address *)local_33b8,&local_34b8,(string *)local_2368);
  cfd::core::Address::operator=(&local_1718.address,(Address *)local_33b8);
  cfd::core::Address::~Address((Address *)local_33b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_1718.descriptor,0,(char *)local_1718.descriptor._M_string_length,0x5c567b
            );
  cfd::core::Amount::Amount((Amount *)local_33b8,100000000000000);
  local_1718.amount.ignore_check_ = local_33b0.ptr_._0_1_;
  local_1718.amount.amount_ = (int64_t)local_33b8;
  local_1718.address_type = kP2pkhAddress;
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_33b8,(string *)local_2368);
  cfd::core::ConfidentialAssetId::operator=(&local_1718.asset,(ConfidentialAssetId *)local_33b8);
  local_33b8 = (undefined1  [8])&PTR__ConfidentialAssetId_0087ccc8;
  pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  cfd::UtxoData::UtxoData(&local_1c40);
  local_1c40.block_height = 0;
  local_1c40.binary_data = (void *)0x0;
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_33b8,(string *)local_2368);
  cfd::core::Txid::operator=(&local_1c40.txid,(Txid *)local_33b8);
  local_33b8 = (undefined1  [8])&PTR__Txid_0087c9b8;
  pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  local_1c40.vout = 0;
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_33b8,(string *)local_2368);
  cfd::core::Script::operator=(&local_1c40.locking_script,(Script *)local_33b8);
  cfd::core::Script::~Script((Script *)local_33b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE","");
  cfd::AddressFactory::GetAddress((Address *)local_33b8,&local_34b8,(string *)local_2368);
  cfd::core::Address::operator=(&local_1c40.address,(Address *)local_33b8);
  cfd::core::Address::~Address((Address *)local_33b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_1c40.descriptor,0,(char *)local_1c40.descriptor._M_string_length,0x58a2c5
            );
  cfd::core::Amount::Amount((Amount *)local_33b8,18000000000000);
  local_1c40.amount.ignore_check_ = local_33b0.ptr_._0_1_;
  local_1c40.amount.amount_ = (int64_t)local_33b8;
  local_1c40.address_type = kP2shP2wpkhAddress;
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_33b8,(string *)local_2368);
  cfd::core::ConfidentialAssetId::operator=(&local_1c40.asset,(ConfidentialAssetId *)local_33b8);
  local_33b8 = (undefined1  [8])&PTR__ConfidentialAssetId_0087ccc8;
  pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e"
             ,"");
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_33b8,(string *)local_2368);
  cfd::core::BlindFactor::operator=(&local_1c40.asset_blind_factor,(BlindFactor *)local_33b8);
  local_33b8 = (undefined1  [8])&PTR__BlindFactor_0087ca68;
  pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc"
             ,"");
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_33b8,(string *)local_2368);
  cfd::core::BlindFactor::operator=(&local_1c40.amount_blind_factor,(BlindFactor *)local_33b8);
  local_33b8 = (undefined1  [8])&PTR__BlindFactor_0087ca68;
  pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,
             "09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa","");
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_33b8,(string *)local_2368);
  cfd::core::ConfidentialValue::operator=
            (&local_1c40.value_commitment,(ConfidentialValue *)local_33b8);
  local_33b8 = (undefined1  [8])&PTR__ConfidentialValue_0087cda8;
  pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  cfd::UtxoData::UtxoData(&local_1038);
  local_1038.block_height = 0;
  local_1038.binary_data = (void *)0x0;
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_33b8,(string *)local_2368);
  cfd::core::Txid::operator=(&local_1038.txid,(Txid *)local_33b8);
  local_33b8 = (undefined1  [8])&PTR__Txid_0087c9b8;
  pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  local_1038.vout = 1;
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4","");
  cfd::core::Script::Script((Script *)local_33b8,(string *)local_2368);
  cfd::core::Script::operator=(&local_1038.locking_script,(Script *)local_33b8);
  cfd::core::Script::~Script((Script *)local_33b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w","");
  cfd::AddressFactory::GetAddress((Address *)local_33b8,&local_34b8,(string *)local_2368);
  cfd::core::Address::operator=(&local_1038.address,(Address *)local_33b8);
  cfd::core::Address::~Address((Address *)local_33b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_1038.descriptor,0,(char *)local_1038.descriptor._M_string_length,0x5c567a
            );
  cfd::core::Amount::Amount((Amount *)local_33b8,100000000000000);
  local_1038.amount.ignore_check_ = local_33b0.ptr_._0_1_;
  local_1038.amount.amount_ = (int64_t)local_33b8;
  local_1038.address_type = kP2wpkhAddress;
  local_2368._0_8_ = local_2358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2368,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_33b8,(string *)local_2368);
  cfd::core::ConfidentialAssetId::operator=(&local_1038.asset,(ConfidentialAssetId *)local_33b8);
  local_33b8 = (undefined1  [8])&PTR__ConfidentialAssetId_0087ccc8;
  pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368._0_8_ != local_2358) {
    operator_delete((void *)local_2368._0_8_,local_2358[0]._M_allocated_capacity + 1);
  }
  local_33b8 = (undefined1  [8])local_33a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_33b8,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz","");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_11f0,(string *)local_33b8);
  if (local_33b8 != (undefined1  [8])local_33a8) {
    operator_delete((void *)local_33b8,(ulong)(local_33a8[0]._M_allocated_capacity + 1));
  }
  local_33b8 = (undefined1  [8])local_33a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_33b8,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS","");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_1df8,(string *)local_33b8);
  if (local_33b8 != (undefined1  [8])local_33a8) {
    operator_delete((void *)local_33b8,(ulong)(local_33a8[0]._M_allocated_capacity + 1));
  }
  cfd::core::Amount::Amount(&local_3538,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_3490,2,0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::ConfidentialTransactionContext::AddInput(&local_3490,&local_1718);
    }
  }
  else {
    testing::Message::Message((Message *)local_33b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x160,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2368,(Message *)local_33b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2368);
    if (local_33b8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_33b8 + 8))();
      }
      local_33b8 = (undefined1  [8])0x0;
    }
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)local_33b8,&local_1c40.txid,local_1c40.vout);
  cfd::ConfidentialTransactionContext::AddTxIn(&local_3490,(OutPoint *)local_33b8);
  local_33b8 = (undefined1  [8])&PTR__Txid_0087c9b8;
  pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)local_33b8,&local_1038.txid,local_1038.vout);
  cfd::ConfidentialTransactionContext::AddTxIn(&local_3490,(OutPoint *)local_33b8);
  local_33b8 = (undefined1  [8])&PTR__Txid_0087c9b8;
  pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
  }
  AVar8 = cfd::core::operator+(&local_1718.amount,&local_1038.amount);
  local_2368._0_8_ = AVar8.amount_;
  local_2368[8] = AVar8.ignore_check_;
  AVar8 = cfd::core::operator-((Amount *)local_2368,&local_3538);
  local_33b8 = (undefined1  [8])AVar8.amount_;
  local_33b0.ptr_._0_1_ = AVar8.ignore_check_;
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_3490,&local_11f0,(Amount *)local_33b8,&local_1718.asset,false);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress((Address *)local_33b8,&local_1df8);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_3490,(Address *)local_33b8,&local_1c40.amount,&local_1c40.asset);
  cfd::core::Address::~Address((Address *)local_33b8);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            (&local_3490.super_ConfidentialTransaction,&local_3538,&local_1718.asset);
  cfd::UtxoData::UtxoData((UtxoData *)local_33b8,&local_1718);
  cfd::UtxoData::UtxoData((UtxoData *)local_2e90,&local_1c40);
  cfd::UtxoData::UtxoData((UtxoData *)(local_2e48 + 0x4e0),&local_1038);
  __l._M_len = 3;
  __l._M_array = (UtxoData *)local_33b8;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_34f8,__l,(allocator_type *)local_2368);
  lVar6 = 0xa50;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_33b8 + lVar6));
    lVar6 = lVar6 + -0x528;
  } while (lVar6 != -0x528);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo(&local_3490,&local_34f8);
    }
  }
  else {
    testing::Message::Message((Message *)local_33b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x168,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2368,(Message *)local_33b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2368);
    if (local_33b8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_33b8 + 8))();
      }
      local_33b8 = (undefined1  [8])0x0;
    }
  }
  cfd::UtxoData::UtxoData((UtxoData *)local_2368);
  local_1e40 = 0;
  uStack_1e3e = 0;
  uStack_1e3c = 0;
  cfd::core::Script::Script(&local_1e38);
  local_1e00 = 0;
  cfd::UtxoData::UtxoData(&local_b10);
  local_5e8 = 0;
  uStack_5e6 = 0;
  uStack_5e4 = 0;
  cfd::core::Script::Script(&local_5e0);
  local_5a8 = 0;
  cfd::UtxoData::UtxoData(&local_5a0);
  local_78 = 0;
  uStack_76 = 0;
  uStack_74 = 0;
  cfd::core::Script::Script(&local_70);
  local_38 = 0;
  cfd::UtxoData::operator=((UtxoData *)local_2368,&local_1718);
  cfd::UtxoData::operator=(&local_b10,&local_1c40);
  cfd::UtxoData::operator=(&local_5a0,&local_1038);
  cfd::UtxoData::UtxoData((UtxoData *)local_33b8,(UtxoData *)local_2368);
  local_2e90._0_8_ = CONCAT44(uStack_1e3c,CONCAT13(uStack_1e3d,CONCAT12(uStack_1e3e,local_1e40)));
  cfd::core::Script::Script((Script *)(local_2e90 + 8),&local_1e38);
  local_2e50 = local_1e00;
  cfd::UtxoData::UtxoData((UtxoData *)local_2e48,&local_b10);
  local_2920 = CONCAT44(uStack_5e4,CONCAT13(uStack_5e5,CONCAT12(uStack_5e6,local_5e8)));
  cfd::core::Script::Script(&local_2918,&local_5e0);
  local_28e0 = local_5a8;
  cfd::UtxoData::UtxoData(&local_28d8,&local_5a0);
  local_23b0 = CONCAT44(uStack_74,CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)));
  cfd::core::Script::Script(&local_23a8,&local_70);
  local_2370 = local_38;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_33b8;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector(&local_3510,__l_00,(allocator_type *)&local_3618);
  lVar6 = -0x1050;
  this_00 = &local_23a8;
  do {
    cfd::core::Script::~Script(this_00);
    cfd::UtxoData::~UtxoData
              ((UtxoData *)
               &this_00[-0x18].script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish);
    this_00 = (Script *)&this_00[-0x19].script_data_;
    lVar6 = lVar6 + 0x570;
  } while (lVar6 != 0);
  cfd::core::Amount::Amount(&local_3580);
  cfd::core::Amount::Amount(&local_3548);
  cfd::core::Amount::Amount(&local_3558);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_33b8,(AbstractTransaction *)&local_3490);
  utxo_fee_00 = &local_3548;
  AVar8 = cfd::api::ElementsTransactionApi::EstimateFee
                    (&local_35b1,(string *)local_33b8,&local_3510,&local_1718.asset,&local_3558,
                     utxo_fee_00,true,0.1,0,0x24,(uint32_t *)0x0);
  local_3580.amount_ = AVar8.amount_;
  local_3580.ignore_check_ = AVar8.ignore_check_;
  if (local_33b8 != (undefined1  [8])local_33a8) {
    operator_delete((void *)local_33b8,(ulong)(local_33a8[0]._M_allocated_capacity + 1));
  }
  local_3618._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_3580);
  local_35f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_35f8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x100);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_33b8,"calc_fee.GetSatoshiValue()","256",(long *)&local_3618,
             (int *)&local_35f8);
  if (local_33b8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_3618);
    if ((undefined8 *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_35f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_35f8,(Message *)&local_3618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_35f8);
    if ((long *)local_3618._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3618._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3618._M_dataplus._M_p + 8))();
      }
      local_3618._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_33b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3618._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_3558);
  local_35f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_35f8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0xe1);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_33b8,"tx_fee.GetSatoshiValue()","225",(long *)&local_3618,
             (int *)&local_35f8);
  if (local_33b8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_3618);
    if ((undefined8 *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_35f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_35f8,(Message *)&local_3618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_35f8);
    if ((long *)local_3618._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3618._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3618._M_dataplus._M_p + 8))();
      }
      local_3618._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_33b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3618._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_3548);
  local_35f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_35f8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x20);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_33b8,"utxo_fee.GetSatoshiValue()","32",(long *)&local_3618,
             (int *)&local_35f8);
  if (local_33b8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_3618);
    if ((undefined8 *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_35f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x17f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_35f8,(Message *)&local_3618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_35f8);
    if ((long *)local_3618._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3618._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3618._M_dataplus._M_p + 8))();
      }
      local_3618._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_33b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3528.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3528.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3528.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_3528,&local_1df8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      utxo_fee_00 = (Amount *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                (&local_3490,&local_3528,1,0,0x24,
                 (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)local_33b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x183,
               "Expected: txc.Blind(&ct_addrs, 1, 0, 36) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3618,(Message *)local_33b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3618);
    if (local_33b8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_33b8 + 8))();
      }
      local_33b8 = (undefined1  [8])0x0;
    }
  }
  cfd::core::ConfidentialTransaction::GetTxOutList
            (&local_3570,&local_3490.super_ConfidentialTransaction);
  local_3618._M_dataplus._M_p =
       (pointer)(((long)local_3570.
                        super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_3570.
                        super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1084210842108421);
  local_35f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_35f8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_33b8,"txouts.size()","3",(unsigned_long *)&local_3618,
             (int *)&local_35f8);
  if (local_33b8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_3618);
    if ((undefined8 *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_35f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x185,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_35f8,(Message *)&local_3618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_35f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3618._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3618._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_3618._M_dataplus._M_p + 8))();
      }
      local_3618._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_33b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long)local_3570.
            super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_3570.
            super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x2e8) {
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)local_33b8,
               &(local_3570.
                 super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                 ._M_impl.super__Vector_impl_data._M_start)->confidential_value_);
    bVar2 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)local_33b8);
    local_3618._M_dataplus._M_p._0_1_ = bVar2;
    local_3618._M_string_length = 0;
    local_33b8 = (undefined1  [8])&PTR__ConfidentialValue_0087cda8;
    pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
    }
    if ((char)local_3618._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_35f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_33b8,(internal *)&local_3618,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)utxo_fee_00);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_35d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x187,(char *)local_33b8);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_35d8,(Message *)&local_35f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_35d8);
      if (local_33b8 != (undefined1  [8])local_33a8) {
        operator_delete((void *)local_33b8,(ulong)(local_33a8[0]._M_allocated_capacity + 1));
      }
      if ((long *)local_35f8.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)local_35f8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0)) {
          (**(code **)(*(long *)local_35f8.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 8))();
        }
        local_35f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_3618._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)local_33b8,
               &local_3570.
                super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_start[1].confidential_value_);
    bVar2 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)local_33b8);
    local_3618._M_dataplus._M_p._0_1_ = bVar2;
    local_3618._M_string_length = 0;
    local_33b8 = (undefined1  [8])&PTR__ConfidentialValue_0087cda8;
    pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
    }
    if ((char)local_3618._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_35f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_33b8,(internal *)&local_3618,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)utxo_fee_00);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_35d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x188,(char *)local_33b8);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_35d8,(Message *)&local_35f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_35d8);
      if (local_33b8 != (undefined1  [8])local_33a8) {
        operator_delete((void *)local_33b8,(ulong)(local_33a8[0]._M_allocated_capacity + 1));
      }
      if ((long *)local_35f8.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)local_35f8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0)) {
          (**(code **)(*(long *)local_35f8.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 8))();
        }
        local_35f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_3618._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)local_33b8,
               &local_3570.
                super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_start[2].confidential_value_);
    bVar2 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)local_33b8);
    local_3618._M_dataplus._M_p._0_1_ = !bVar2;
    local_3618._M_string_length = 0;
    local_33b8 = (undefined1  [8])&PTR__ConfidentialValue_0087cda8;
    pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
    }
    if ((char)local_3618._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_35f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_33b8,(internal *)&local_3618,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","true","false",
                 (char *)utxo_fee_00);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_35d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x189,(char *)local_33b8);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_35d8,(Message *)&local_35f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_35d8);
      if (local_33b8 != (undefined1  [8])local_33a8) {
        operator_delete((void *)local_33b8,(ulong)(local_33a8[0]._M_allocated_capacity + 1));
      }
      if ((long *)local_35f8.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)local_35f8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0)) {
          (**(code **)(*(long *)local_35f8.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 8))();
        }
        local_35f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_3618._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  cfd::core::ByteData::ByteData(&local_3598);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_33b8,&local_1718.txid,local_1718.vout);
      local_3618._M_dataplus._M_p = (pointer)&local_3618.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3618,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_35b0,&local_3618);
      local_35d8._0_8_ = (AssertHelperData *)(local_35d8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_35d8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_35f8,(string *)local_35d8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_34c4);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&local_3490,(OutPoint *)local_33b8,&local_35b0,&local_35f8,&local_34c4,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if ((long *)local_35f8.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_35f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_35f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_35f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((AssertHelperData *)local_35d8._0_8_ != (AssertHelperData *)(local_35d8 + 0x10)) {
        operator_delete((void *)local_35d8._0_8_,local_35d8._16_8_ + 1);
      }
      if (local_35b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_35b0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_35b0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_35b0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3618._M_dataplus._M_p != &local_3618.field_2) {
        operator_delete(local_3618._M_dataplus._M_p,local_3618.field_2._M_allocated_capacity + 1);
      }
      local_33b8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_33b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x191,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3618,(Message *)local_33b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3618);
    if (local_33b8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_33b8 + 8))();
      }
      local_33b8 = (undefined1  [8])0x0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_33b8,&local_1718.txid,local_1718.vout);
      cfd::ConfidentialTransactionContext::Verify(&local_3490,(OutPoint *)local_33b8);
      local_33b8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_33b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x192,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3618,(Message *)local_33b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3618);
    if (local_33b8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_33b8 + 8))();
      }
      local_33b8 = (undefined1  [8])0x0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::ConfidentialTransactionContext::Finalize((ByteData *)local_33b8,&local_3490);
    cfd::core::ByteData::operator=(&local_3598,(ByteData *)local_33b8);
    if (local_33b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_33b8,local_33a8[0]._M_allocated_capacity - (long)local_33b8);
    }
  }
  testing::Message::Message((Message *)local_33b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_3618,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x194,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_3618,(Message *)local_33b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3618);
  if (local_33b8 != (undefined1  [8])0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_33b8 + 8))();
    }
    local_33b8 = (undefined1  [8])0x0;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_33b8,&local_1c40.txid,local_1c40.vout);
      local_3618._M_dataplus._M_p = (pointer)&local_3618.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3618,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_35b0,&local_3618);
      local_35d8._0_8_ = (AssertHelperData *)(local_35d8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_35d8,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif(&local_35f8,(string *)local_35d8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_34d0);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&local_3490,(OutPoint *)local_33b8,&local_35b0,&local_35f8,&local_34d0,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if ((long *)local_35f8.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_35f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_35f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_35f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((AssertHelperData *)local_35d8._0_8_ != (AssertHelperData *)(local_35d8 + 0x10)) {
        operator_delete((void *)local_35d8._0_8_,local_35d8._16_8_ + 1);
      }
      if (local_35b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_35b0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_35b0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_35b0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3618._M_dataplus._M_p != &local_3618.field_2) {
        operator_delete(local_3618._M_dataplus._M_p,local_3618.field_2._M_allocated_capacity + 1);
      }
      local_33b8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_33b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x199,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3618,(Message *)local_33b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3618);
    if (local_33b8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_33b8 + 8))();
      }
      local_33b8 = (undefined1  [8])0x0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_33b8,&local_1c40.txid,local_1c40.vout);
      cfd::ConfidentialTransactionContext::Verify(&local_3490,(OutPoint *)local_33b8);
      local_33b8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_33b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x19a,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3618,(Message *)local_33b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3618);
    if (local_33b8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_33b8 + 8))();
      }
      local_33b8 = (undefined1  [8])0x0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::ConfidentialTransactionContext::Finalize((ByteData *)local_33b8,&local_3490);
    cfd::core::ByteData::operator=(&local_3598,(ByteData *)local_33b8);
    if (local_33b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_33b8,local_33a8[0]._M_allocated_capacity - (long)local_33b8);
    }
  }
  testing::Message::Message((Message *)local_33b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_3618,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x19c,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_3618,(Message *)local_33b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3618);
  if (local_33b8 != (undefined1  [8])0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_33b8 + 8))();
    }
    local_33b8 = (undefined1  [8])0x0;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_33b8,&local_1038.txid,local_1038.vout);
      local_3618._M_dataplus._M_p = (pointer)&local_3618.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3618,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_35b0,&local_3618);
      local_35d8._0_8_ = (AssertHelperData *)(local_35d8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_35d8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_35f8,(string *)local_35d8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_34dc);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&local_3490,(OutPoint *)local_33b8,&local_35b0,&local_35f8,&local_34dc,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if ((long *)local_35f8.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_35f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_35f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_35f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((AssertHelperData *)local_35d8._0_8_ != (AssertHelperData *)(local_35d8 + 0x10)) {
        operator_delete((void *)local_35d8._0_8_,local_35d8._16_8_ + 1);
      }
      if (local_35b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_35b0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_35b0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_35b0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3618._M_dataplus._M_p != &local_3618.field_2) {
        operator_delete(local_3618._M_dataplus._M_p,local_3618.field_2._M_allocated_capacity + 1);
      }
      local_33b8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_33b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a1,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3618,(Message *)local_33b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3618);
    if (local_33b8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_33b8 + 8))();
      }
      local_33b8 = (undefined1  [8])0x0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_33b8,&local_1038.txid,local_1038.vout);
      cfd::ConfidentialTransactionContext::Verify(&local_3490,(OutPoint *)local_33b8);
      local_33b8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar1 = (void *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_33a8[0]._8_8_ - (long)pvVar1);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_33b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a2,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3618,(Message *)local_33b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3618);
    if (local_33b8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_33b8 + 8))();
      }
      local_33b8 = (undefined1  [8])0x0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::ConfidentialTransactionContext::Finalize((ByteData *)local_33b8,&local_3490);
      cfd::core::ByteData::operator=(&local_3598,(ByteData *)local_33b8);
      if (local_33b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_33b8,local_33a8[0]._M_allocated_capacity - (long)local_33b8);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_33b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1a4,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3618,(Message *)local_33b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3618);
    if (local_33b8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_33b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_33b8 + 8))();
      }
      local_33b8 = (undefined1  [8])0x0;
    }
  }
  sVar4 = cfd::core::ByteData::GetDataSize(&local_3598);
  if ((((sVar4 != 0x2155) &&
       (sVar4 = cfd::core::ByteData::GetDataSize(&local_3598), sVar4 != 0x2156)) &&
      (sVar4 = cfd::core::ByteData::GetDataSize(&local_3598), sVar4 != 0x2157)) &&
     (sVar4 = cfd::core::ByteData::GetDataSize(&local_3598), sVar4 != 0x2158)) {
    local_3618._M_dataplus._M_p = (pointer)cfd::core::ByteData::GetDataSize(&local_3598);
    local_35f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)((ulong)local_35f8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_33b8,"tx.GetDataSize()","0",(unsigned_long *)&local_3618,
               (int *)&local_35f8);
    if (local_33b8[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_3618);
      if ((undefined8 *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_) == (undefined8 *)0x0)
      {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_35f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x1a8,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_35f8,(Message *)&local_3618)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_35f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3618._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3618._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0)) {
          (**(code **)(*(size_type *)local_3618._M_dataplus._M_p + 8))();
        }
        local_3618._M_dataplus._M_p = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_33b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  uVar3 = cfd::core::ConfidentialTransaction::GetVsize(&local_3490.super_ConfidentialTransaction);
  if (((uVar3 != 0x9f7) &&
      (uVar3 = cfd::core::ConfidentialTransaction::GetVsize
                         (&local_3490.super_ConfidentialTransaction), uVar3 != 0x9f8)) &&
     (uVar3 = cfd::core::ConfidentialTransaction::GetVsize
                        (&local_3490.super_ConfidentialTransaction), uVar3 != 0x9f9)) {
    uVar3 = cfd::core::ConfidentialTransaction::GetVsize(&local_3490.super_ConfidentialTransaction);
    local_3618._M_dataplus._M_p._0_4_ = uVar3;
    local_35f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_35f8.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x9f8);
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)local_33b8,"txc.GetVsize()","2552",(uint *)&local_3618,(int *)&local_35f8
              );
    if (local_33b8[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_3618);
      if ((undefined8 *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_) == (undefined8 *)0x0)
      {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_35f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x1ac,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_35f8,(Message *)&local_3618)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_35f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3618._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3618._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0)) {
          (**(code **)(*(size_type *)local_3618._M_dataplus._M_p + 8))();
        }
        local_3618._M_dataplus._M_p = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_33b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  uVar3 = cfd::core::ConfidentialTransaction::GetVsize(&local_3490.super_ConfidentialTransaction);
  local_35d8._0_4_ = (uVar3 * 100) / 1000;
  local_3618._M_dataplus._M_p._0_4_ = 0xff;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_33b8,"minimum_fee","255",(uint *)local_35d8,(int *)&local_3618);
  if (local_33b8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_3618);
    if ((undefined8 *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_35f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x1b0,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_35f8,(Message *)&local_3618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_35f8);
    if ((long *)local_3618._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3618._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3618._M_dataplus._M_p + 8))();
      }
      local_3618._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_33b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Amount::GetSatoshiValue(&local_3580);
  if (uVar5 != (local_35d8._0_8_ & 0xffffffff)) {
    uVar5 = cfd::core::Amount::GetSatoshiValue(&local_3580);
    if (uVar5 != local_35d8._0_4_ + 1) {
      uVar5 = cfd::core::Amount::GetSatoshiValue(&local_3580);
      if (uVar5 != local_35d8._0_4_ + 2) {
        local_3618._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_3580);
        testing::internal::CmpHelperEQ<long,unsigned_int>
                  ((internal *)local_33b8,"calc_fee.GetSatoshiValue()","minimum_fee",
                   (long *)&local_3618,(uint *)local_35d8);
        if (local_33b8[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_3618);
          if ((undefined8 *)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_) ==
              (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)CONCAT71(local_33b0.ptr_._1_7_,local_33b0.ptr_._0_1_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_35f8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                     ,0x1b4,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_35f8,(Message *)&local_3618);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_35f8);
          if ((long *)local_3618._M_dataplus._M_p != (long *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && ((long *)local_3618._M_dataplus._M_p != (long *)0x0)) {
              (**(code **)(*(long *)local_3618._M_dataplus._M_p + 8))();
            }
            local_3618._M_dataplus._M_p = (pointer)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_33b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               );
      }
    }
  }
  if (local_3598.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3598.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3598.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3598.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&local_3570);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&local_3528);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&local_3510);
  cfd::core::Script::~Script(&local_70);
  cfd::UtxoData::~UtxoData(&local_5a0);
  cfd::core::Script::~Script(&local_5e0);
  cfd::UtxoData::~UtxoData(&local_b10);
  cfd::core::Script::~Script(&local_1e38);
  cfd::UtxoData::~UtxoData((UtxoData *)local_2368);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_34f8);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_3490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1df8.address_._M_dataplus._M_p != &local_1df8.address_.field_2) {
    operator_delete(local_1df8.address_._M_dataplus._M_p,
                    local_1df8.address_.field_2._M_allocated_capacity + 1);
  }
  if (local_1df8.confidential_key_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1df8.confidential_key_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1df8.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1df8.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::core::Address::~Address(&local_1df8.unblinded_address_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11f0.address_._M_dataplus._M_p != &local_11f0.address_.field_2) {
    operator_delete(local_11f0.address_._M_dataplus._M_p,
                    local_11f0.address_.field_2._M_allocated_capacity + 1);
  }
  if (local_11f0.confidential_key_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11f0.confidential_key_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_11f0.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_11f0.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::core::Address::~Address(&local_11f0.unblinded_address_);
  cfd::UtxoData::~UtxoData(&local_1038);
  cfd::UtxoData::~UtxoData(&local_1c40);
  cfd::UtxoData::~UtxoData(&local_1718);
  local_34b8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_0087aa98;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_34b8.prefix_list_);
  return;
}

Assistant:

TEST(ElementsTransactionApi, EstimateFee_LargeAmount_MinBits36)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{100000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.asset_blind_factor = BlindFactor("");
  // utxo1.amount_blind_factor = BlindFactor("");
  // utxo1.value_commitment = ConfidentialValue("");

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // blinding key: '66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{18000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  // utxo2.confidential_address;
  utxo2.asset_blind_factor = BlindFactor("23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e");
  utxo2.amount_blind_factor = BlindFactor("6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc");
  utxo2.value_commitment = ConfidentialValue("09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa");

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{100000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxIn(OutPoint(utxo3.txid, utxo3.vout));
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee, utxo1.asset);
  txc.AddTxOut(asset_address.GetUnblindedAddress(), utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(fee, utxo1.asset);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ElementsUtxoAndOption eutxo1;
  ElementsUtxoAndOption eutxo2;
  ElementsUtxoAndOption eutxo3;
  eutxo1.utxo = utxo1;
  eutxo2.utxo = utxo2;
  eutxo3.utxo = utxo3;
  std::vector<cfd::api::ElementsUtxoAndOption> utxos_and_options{
      eutxo1, eutxo2, eutxo3
  };

  // check estimateFee
  double effective_fee_rate = 0.1;
  uint64_t effective_fee_rate2 = 100;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  ElementsTransactionApi api;
  calc_fee = api.EstimateFee(txc.GetHex(), utxos_and_options, utxo1.asset,
      &tx_fee, &utxo_fee, true, effective_fee_rate, 0, 36);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 256);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 225);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 32);

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  ct_addrs.push_back(asset_address);
  EXPECT_NO_THROW(txc.Blind(&ct_addrs, 1, 0, 36));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 3);
  if (txouts.size() == 3) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[2].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 8533) && (tx.GetDataSize() != 8534) &&
      (tx.GetDataSize() != 8535) && (tx.GetDataSize() != 8536)) {
    EXPECT_EQ(tx.GetDataSize(), 0);
  }

  if ((txc.GetVsize() != 2551) && (txc.GetVsize() != 2552) && (txc.GetVsize() != 2553)) {
    EXPECT_EQ(txc.GetVsize(), 2552);
  }

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate2) / 1000;
  EXPECT_EQ(minimum_fee, 255);
  if ((calc_fee.GetSatoshiValue() != minimum_fee) &&
      (calc_fee.GetSatoshiValue() != (minimum_fee + 1)) &&
      (calc_fee.GetSatoshiValue() != (minimum_fee + 2))) {
    EXPECT_EQ(calc_fee.GetSatoshiValue(), minimum_fee);
  }
  // EXPECT_STREQ(tx.GetHex().c_str(), "");
}